

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

void free_StreamsInfo(_7z_stream_info *si)

{
  _7z_folder *p_Var1;
  _7z_folder *p_Var2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  free((si->pi).sizes);
  free((si->pi).positions);
  free((si->pi).digest.defineds);
  free((si->pi).digest.digests);
  if ((si->ci).folders != (_7z_folder *)0x0) {
    if ((si->ci).numFolders != 0) {
      uVar6 = 0;
      do {
        p_Var2 = (si->ci).folders;
        p_Var1 = p_Var2 + uVar6;
        if (p_Var2[uVar6].coders != (_7z_coder *)0x0) {
          if (p_Var1->numCoders != 0) {
            uVar4 = 0;
            uVar5 = 1;
            do {
              free(p_Var1->coders[uVar4].properties);
              bVar3 = uVar5 < p_Var1->numCoders;
              uVar4 = uVar5;
              uVar5 = (ulong)((int)uVar5 + 1);
            } while (bVar3);
          }
          free(p_Var1->coders);
        }
        free(p_Var1->bindPairs);
        free(p_Var1->packedStreams);
        free(p_Var1->unPackSize);
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (uVar6 < (si->ci).numFolders);
    }
    free((si->ci).folders);
  }
  free((si->ss).unpackSizes);
  free((si->ss).digestsDefined);
  free((si->ss).digests);
  return;
}

Assistant:

static void
free_StreamsInfo(struct _7z_stream_info *si)
{
	free_PackInfo(&(si->pi));
	free_CodersInfo(&(si->ci));
	free_SubStreamsInfo(&(si->ss));
}